

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O1

duckdb_state
duckdb_table_description_create_ext
          (duckdb_connection connection,char *catalog,char *schema,char *table,
          duckdb_table_description *out)

{
  TableDescription *__ptr_00;
  undefined8 uVar1;
  default_delete<duckdb::TableDescription> *this;
  size_t sVar2;
  char *pcVar3;
  pointer *__ptr;
  duckdb_state dVar4;
  ErrorData error;
  undefined1 local_108 [24];
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0 [4];
  
  dVar4 = DuckDBError;
  if (out != (duckdb_table_description *)0x0) {
    local_108._16_8_ = connection;
    this = (default_delete<duckdb::TableDescription> *)operator_new(0x28);
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    *(undefined8 *)(this + 0x20) = 0;
    *(default_delete<duckdb::TableDescription> **)(this + 8) = this + 0x18;
    *(undefined8 *)(this + 0x10) = 0;
    this[0x18] = (default_delete<duckdb::TableDescription>)0x0;
    *out = (duckdb_table_description)this;
    if (table != (char *)0x0 && (string *)local_108._16_8_ != (string *)0x0) {
      local_108._8_8_ = this + 8;
      pcVar3 = anon_var_dwarf_4f470fa + 9;
      if (catalog != (char *)0x0) {
        pcVar3 = catalog;
      }
      local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
      sVar2 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,pcVar3,pcVar3 + sVar2);
      pcVar3 = "main";
      if (schema != (char *)0x0) {
        pcVar3 = schema;
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      sVar2 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar3,pcVar3 + sVar2);
      local_f0 = local_e0;
      sVar2 = strlen(table);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,table,table + sVar2);
      duckdb::Connection::TableInfo
                ((Connection *)local_108,(string *)local_108._16_8_,local_b0,&local_d0);
      uVar1 = local_108._0_8_;
      local_108._0_8_ = (element_type *)0x0;
      __ptr_00 = *(TableDescription **)this;
      *(undefined8 *)this = uVar1;
      if (__ptr_00 != (TableDescription *)0x0) {
        std::default_delete<duckdb::TableDescription>::operator()(this,__ptr_00);
      }
      if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
        std::default_delete<duckdb::TableDescription>::operator()
                  ((default_delete<duckdb::TableDescription> *)local_108,
                   (TableDescription *)local_108._0_8_);
      }
      local_108._0_8_ = (element_type *)0x0;
      if (local_f0 != local_e0) {
        operator_delete(local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
        operator_delete(local_b0[0]._M_dataplus._M_p);
      }
      dVar4 = DuckDBSuccess;
      if (*(long *)this == 0) {
        std::__cxx11::string::_M_replace(local_108._8_8_,0,*(char **)(this + 0x10),0x1e3d302);
        dVar4 = DuckDBError;
      }
    }
  }
  return dVar4;
}

Assistant:

duckdb_state duckdb_table_description_create_ext(duckdb_connection connection, const char *catalog, const char *schema,
                                                 const char *table, duckdb_table_description *out) {
	Connection *conn = reinterpret_cast<Connection *>(connection);

	if (!out) {
		return DuckDBError;
	}
	auto wrapper = new TableDescriptionWrapper();
	*out = reinterpret_cast<duckdb_table_description>(wrapper);

	if (!connection || !table) {
		return DuckDBError;
	}
	if (catalog == nullptr) {
		catalog = INVALID_CATALOG;
	}
	if (schema == nullptr) {
		schema = DEFAULT_SCHEMA;
	}

	try {
		wrapper->description = conn->TableInfo(catalog, schema, table);
	} catch (std::exception &ex) {
		ErrorData error(ex);
		wrapper->error = error.RawMessage();
		return DuckDBError;
	} catch (...) { // LCOV_EXCL_START
		wrapper->error = "Unknown Connection::TableInfo error";
		return DuckDBError;
	} // LCOV_EXCL_STOP
	if (!wrapper->description) {
		wrapper->error = "No table with that schema+name could be located";
		return DuckDBError;
	}
	return DuckDBSuccess;
}